

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_3ca5d1::cmCMakeLanguageCommandDEFER
               (Defer *defer,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args,size_t arg,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer __s1;
  size_type sVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  string *psVar7;
  string *id;
  byte bVar8;
  size_type __rlen;
  _Alloc_hider _Var9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string_view value;
  string_view value_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> call;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ids;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  pointer local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  bool local_70;
  cmMakefile *local_68;
  string local_60;
  static_string_view local_40;
  
  local_68 = defer->Directory;
  if (local_68 == (cmMakefile *)0x0) {
    local_68 = status->Makefile;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __s1 = pbVar1[arg]._M_dataplus._M_p;
  sVar2 = pbVar1[arg]._M_string_length;
  if (sVar2 == 8) {
    iVar5 = bcmp(__s1,"GET_CALL",8);
    pcVar3 = local_68;
    if (iVar5 != 0) goto LAB_001f7a1a;
    lVar6 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
    if (arg + 1 == lVar6) {
      local_d8._0_8_ = &local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"DEFER GET_CALL missing id","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001f7ef9:
      cmSystemTools::s_FatalErrorOccurred = true;
      local_80._M_allocated_capacity = local_c8._M_allocated_capacity;
      _Var9._M_p = (pointer)local_d8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._0_8_ == &local_c8) goto LAB_001f7f1a;
      goto LAB_001f7f12;
    }
    if (arg + 2 == lVar6) {
      local_d8._0_8_ = &local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"DEFER GET_CALL missing output variable","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001f7ef9;
    }
    if (arg + 3 != lVar6) {
      local_d8._0_8_ = &local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"DEFER GET_CALL given too many arguments","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001f7ef9;
    }
    psVar7 = pbVar1 + arg + 1;
    if (psVar7->_M_string_length == 0) {
      local_d8._0_8_ = &local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"DEFER GET_CALL id may not be empty","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001f7ef9;
    }
    if (0x19 < (byte)(*(psVar7->_M_dataplus)._M_p + 0xbfU)) {
      cmMakefile::DeferGetCall
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_d8,local_68,psVar7);
      bVar8 = local_b8._0_1_;
      if (local_b8._0_1_ == false) {
        local_60._M_dataplus._M_p = (pointer)0x2b;
        local_60._M_string_length = 0x7c0e5b;
        psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
        local_40.super_string_view._M_len = 0xe;
        local_40.super_string_view._M_str = "\nat this time.";
        cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
                  ((string *)local_90,(static_string_view *)&local_60,psVar7,&local_40);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        cmSystemTools::s_FatalErrorOccurred = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._0_8_ != &local_80) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_80._M_allocated_capacity + 1));
        }
      }
      else {
        value_00._M_str = (char *)local_d8._0_8_;
        value_00._M_len = local_d8._8_8_;
        cmMakefile::AddDefinition(status->Makefile,pbVar1 + arg + 2,value_00);
      }
      if ((local_b8._0_1_ != true) ||
         (local_b8 = (pointer)((ulong)local_b8 & 0xffffffffffffff00),
         local_80._M_allocated_capacity = local_c8._M_allocated_capacity,
         local_90._0_8_ = local_d8._0_8_,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_d8._0_8_ == &local_c8)) goto LAB_001f7f1c;
      goto LAB_001f7ebd;
    }
    local_90._0_8_ = (pointer)0x22;
    local_90._8_8_ = "DEFER GET_CALL unknown argument:\n ";
    cmStrCat<cm::static_string_view,std::__cxx11::string_const&>
              ((string *)local_d8,(static_string_view *)local_90,psVar7);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    cmSystemTools::s_FatalErrorOccurred = true;
    local_80._M_allocated_capacity = local_c8._M_allocated_capacity;
    _Var9._M_p = (pointer)local_d8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._0_8_ != &local_c8) goto LAB_001f7f12;
  }
  else {
    if (sVar2 == 0xc) {
      iVar5 = bcmp(__s1,"GET_CALL_IDS",0xc);
      pcVar3 = local_68;
      if (iVar5 == 0) {
        lVar6 = (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
        if (arg + 1 == lVar6) {
          local_d8._0_8_ = &local_c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"DEFER GET_CALL_IDS missing output variable","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          if (arg + 2 == lVar6) {
            cmMakefile::DeferGetCallIds_abi_cxx11_
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_90,local_68);
            bVar8 = local_70;
            if (local_70 == false) {
              psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
              local_d8._0_8_ = (pointer)0x2f;
              local_d8._8_8_ = "DEFER GET_CALL_IDS may not access directory:\n  ";
              local_c8._M_allocated_capacity = 0;
              local_b8 = (psVar7->_M_dataplus)._M_p;
              local_c8._8_8_ = psVar7->_M_string_length;
              local_b0 = 0;
              local_a8 = 0xe;
              local_a0 = "\nat this time.";
              local_98 = 0;
              views_02._M_len = 3;
              views_02._M_array = (iterator)local_d8;
              cmCatViews(&local_60,views_02);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              cmSystemTools::s_FatalErrorOccurred = true;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              value._M_str = (char *)local_90._0_8_;
              value._M_len = local_90._8_8_;
              cmMakefile::AddDefinition(status->Makefile,pbVar1 + arg + 1,value);
            }
            if (local_70 != true) goto LAB_001f7f1c;
            local_70 = false;
LAB_001f7eaf:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._0_8_ == &local_80) goto LAB_001f7f1c;
LAB_001f7ebd:
            operator_delete((void *)local_90._0_8_,
                            (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_80._M_allocated_capacity)->_M_dataplus)._M_p +
                                   1));
            goto LAB_001f7f1c;
          }
          local_d8._0_8_ = &local_c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"DEFER GET_CALL_IDS given too many arguments","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        goto LAB_001f7ef9;
      }
    }
    else if ((sVar2 == 0xb) && (iVar5 = bcmp(__s1,"CANCEL_CALL",0xb), pcVar3 = local_68, iVar5 == 0)
            ) {
      psVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (id = pbVar1 + arg + 1; bVar8 = id == psVar7, !(bool)bVar8; id = id + 1) {
        if ((byte)(*(id->_M_dataplus)._M_p + 0xbfU) < 0x1a) {
          local_d8._0_8_ = (pointer)0x26;
          local_d8._8_8_ = "DEFER CANCEL_CALL unknown argument:\n  ";
          local_c8._M_allocated_capacity = 0;
          local_b8 = (id->_M_dataplus)._M_p;
          local_c8._8_8_ = id->_M_string_length;
          local_b0 = 0;
          views_00._M_len = 2;
          views_00._M_array = (iterator)local_d8;
          cmCatViews((string *)local_90,views_00);
          std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001f7db2:
          cmSystemTools::s_FatalErrorOccurred = true;
          goto LAB_001f7eaf;
        }
        bVar4 = cmMakefile::DeferCancelCall(pcVar3,id);
        if (!bVar4) {
          psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
          local_d8._0_8_ = (pointer)0x2e;
          local_d8._8_8_ = "DEFER CANCEL_CALL may not update directory:\n  ";
          local_c8._M_allocated_capacity = 0;
          local_b8 = (psVar7->_M_dataplus)._M_p;
          local_c8._8_8_ = psVar7->_M_string_length;
          local_b0 = 0;
          local_a8 = 0xe;
          local_a0 = "\nat this time.";
          local_98 = 0;
          views_01._M_len = 3;
          views_01._M_array = (iterator)local_d8;
          cmCatViews((string *)local_90,views_01);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_001f7db2;
        }
      }
      goto LAB_001f7f1c;
    }
LAB_001f7a1a:
    local_d8._0_8_ = &DAT_00000019;
    local_d8._8_8_ = "DEFER operation unknown: ";
    local_c8._M_allocated_capacity = 0;
    local_b8 = pbVar1[arg]._M_dataplus._M_p;
    local_c8._8_8_ = pbVar1[arg]._M_string_length;
    local_b0 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_d8;
    cmCatViews((string *)local_90,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    cmSystemTools::s_FatalErrorOccurred = true;
    _Var9._M_p = (pointer)local_90._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._0_8_ != &local_80) {
LAB_001f7f12:
      cmSystemTools::s_FatalErrorOccurred = true;
      operator_delete(_Var9._M_p,
                      (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_80._M_allocated_capacity)->_M_dataplus)._M_p + 1));
    }
  }
LAB_001f7f1a:
  bVar8 = 0;
LAB_001f7f1c:
  return (bool)(bVar8 & 1);
}

Assistant:

bool cmCMakeLanguageCommandDEFER(Defer const& defer,
                                 std::vector<std::string> const& args,
                                 size_t arg, cmExecutionStatus& status)
{
  cmMakefile* deferMakefile =
    defer.Directory ? defer.Directory : &status.GetMakefile();
  if (args[arg] == "CANCEL_CALL"_s) {
    ++arg; // Consume CANCEL_CALL.
    auto ids = cmMakeRange(args).advance(arg);
    for (std::string const& id : ids) {
      if (id[0] >= 'A' && id[0] <= 'Z') {
        return FatalError(
          status, cmStrCat("DEFER CANCEL_CALL unknown argument:\n  "_s, id));
      }
      if (!deferMakefile->DeferCancelCall(id)) {
        return FatalError(
          status,
          cmStrCat("DEFER CANCEL_CALL may not update directory:\n  "_s,
                   deferMakefile->GetCurrentBinaryDirectory(),
                   "\nat this time."_s));
      }
    }
    return true;
  }
  if (args[arg] == "GET_CALL_IDS"_s) {
    ++arg; // Consume GET_CALL_IDS.
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL_IDS missing output variable");
    }
    std::string const& var = args[arg++];
    if (arg != args.size()) {
      return FatalError(status, "DEFER GET_CALL_IDS given too many arguments");
    }
    cm::optional<std::string> ids = deferMakefile->DeferGetCallIds();
    if (!ids) {
      return FatalError(
        status,
        cmStrCat("DEFER GET_CALL_IDS may not access directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    status.GetMakefile().AddDefinition(var, *ids);
    return true;
  }
  if (args[arg] == "GET_CALL"_s) {
    ++arg; // Consume GET_CALL.
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL missing id");
    }
    std::string const& id = args[arg++];
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL missing output variable");
    }
    std::string const& var = args[arg++];
    if (arg != args.size()) {
      return FatalError(status, "DEFER GET_CALL given too many arguments");
    }
    if (id.empty()) {
      return FatalError(status, "DEFER GET_CALL id may not be empty");
    }
    if (id[0] >= 'A' && id[0] <= 'Z') {
      return FatalError(status,
                        cmStrCat("DEFER GET_CALL unknown argument:\n "_s, id));
    }
    cm::optional<std::string> call = deferMakefile->DeferGetCall(id);
    if (!call) {
      return FatalError(
        status,
        cmStrCat("DEFER GET_CALL may not access directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    status.GetMakefile().AddDefinition(var, *call);
    return true;
  }
  return FatalError(status,
                    cmStrCat("DEFER operation unknown: "_s, args[arg]));
}